

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct64_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 *puVar9;
  undefined1 (*pauVar10) [32];
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  int local_ae0;
  int iStack_adc;
  int iStack_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int iStack_ac8;
  int iStack_ac4;
  int local_ac0;
  int iStack_abc;
  int iStack_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int iStack_aa8;
  int iStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  __m256i local_840;
  __m256i local_820;
  __m256i local_800;
  __m256i local_7e0;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  longlong local_7a0;
  longlong lStack_798;
  longlong lStack_790;
  longlong lStack_788;
  longlong local_780;
  longlong lStack_778;
  longlong lStack_770;
  longlong lStack_768;
  longlong local_760;
  longlong lStack_758;
  longlong lStack_750;
  longlong lStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  lVar12 = (long)bit * 0x100;
  iVar14 = 1 << ((char)bit - 1U & 0x1f);
  auVar21._4_4_ = iVar14;
  auVar21._0_4_ = iVar14;
  auVar21._8_4_ = iVar14;
  auVar21._12_4_ = iVar14;
  auVar21._16_4_ = iVar14;
  auVar21._20_4_ = iVar14;
  auVar21._24_4_ = iVar14;
  auVar21._28_4_ = iVar14;
  iVar14 = bd + (uint)(do_cols == 0) * 2;
  local_ae0 = 0x8000;
  if (0xf < iVar14 + 6) {
    local_ae0 = 1 << ((char)iVar14 + 5U & 0x1f);
  }
  local_ac0 = -local_ae0;
  local_ae0 = local_ae0 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x164);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29._16_4_ = uVar1;
  auVar29._20_4_ = uVar1;
  auVar29._24_4_ = uVar1;
  auVar29._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x168);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x16c);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x170);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x178);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x25c);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  iVar5 = -iVar14;
  iVar6 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x244);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x17c);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x174);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x24c);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  auVar43._4_4_ = iVar6;
  auVar43._0_4_ = iVar6;
  auVar43._8_4_ = iVar6;
  auVar43._12_4_ = iVar6;
  auVar43._16_4_ = iVar6;
  auVar43._20_4_ = iVar6;
  auVar43._24_4_ = iVar6;
  auVar43._28_4_ = iVar6;
  iVar6 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x254);
  auVar32._4_4_ = iVar6;
  auVar32._0_4_ = iVar6;
  auVar32._8_4_ = iVar6;
  auVar32._12_4_ = iVar6;
  auVar32._16_4_ = iVar6;
  auVar32._20_4_ = iVar6;
  auVar32._24_4_ = iVar6;
  auVar32._28_4_ = iVar6;
  iVar6 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x248);
  auVar50._4_4_ = iVar6;
  auVar50._0_4_ = iVar6;
  auVar50._8_4_ = iVar6;
  auVar50._12_4_ = iVar6;
  auVar50._16_4_ = iVar6;
  auVar50._20_4_ = iVar6;
  auVar50._24_4_ = iVar6;
  auVar50._28_4_ = iVar6;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 600);
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar33._16_4_ = uVar1;
  auVar33._20_4_ = uVar1;
  auVar33._24_4_ = uVar1;
  auVar33._28_4_ = uVar1;
  auVar2 = vpmulld_avx2(auVar29,(undefined1  [32])in[1]);
  auVar3 = vpmulld_avx2(auVar36,(undefined1  [32])in[1]);
  auVar29 = vpmulld_avx2(auVar43,(undefined1  [32])in[7]);
  auVar20 = vpmulld_avx2(auVar39,(undefined1  [32])in[7]);
  auVar22 = vpmulld_avx2(auVar22,(undefined1  [32])in[5]);
  auVar27 = vpmulld_avx2(auVar27,(undefined1  [32])in[5]);
  auVar32 = vpmulld_avx2(auVar32,(undefined1  [32])in[3]);
  auVar26 = vpmulld_avx2(auVar26,(undefined1  [32])in[3]);
  auVar19 = vpmulld_avx2(auVar24,(undefined1  [32])in[2]);
  auVar18 = vpmulld_avx2(auVar33,(undefined1  [32])in[2]);
  auVar17 = vpmulld_avx2(auVar50,(undefined1  [32])in[6]);
  auVar16 = vpmulld_avx2(auVar16,(undefined1  [32])in[6]);
  auVar23._4_4_ = iVar5;
  auVar23._0_4_ = iVar5;
  auVar23._8_4_ = iVar5;
  auVar23._12_4_ = iVar5;
  auVar23._16_4_ = iVar5;
  auVar23._20_4_ = iVar5;
  auVar23._24_4_ = iVar5;
  auVar23._28_4_ = iVar5;
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  local_900 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpaddd_avx2(auVar3,auVar21);
  local_8c0 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x250);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar3 = vpmulld_avx2(local_8c0,auVar23);
  auVar2 = vpmulld_avx2(local_900,auVar46);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar48._4_4_ = iVar14;
  auVar48._0_4_ = iVar14;
  auVar48._8_4_ = iVar14;
  auVar48._12_4_ = iVar14;
  auVar48._16_4_ = iVar14;
  auVar48._20_4_ = iVar14;
  auVar48._24_4_ = iVar14;
  auVar48._28_4_ = iVar14;
  auVar23 = vpmulld_avx2(auVar48,(undefined1  [32])in[4]);
  auVar24 = vpmulld_avx2(auVar46,(undefined1  [32])in[4]);
  auVar30 = vpmulld_avx2(local_8c0,auVar46);
  auVar3 = vpmulld_avx2(local_900,auVar48);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar30);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1d0);
  auVar47._4_4_ = iVar14;
  auVar47._0_4_ = iVar14;
  auVar47._8_4_ = iVar14;
  auVar47._12_4_ = iVar14;
  auVar47._16_4_ = iVar14;
  auVar47._20_4_ = iVar14;
  auVar47._24_4_ = iVar14;
  auVar47._28_4_ = iVar14;
  iVar6 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x1f0);
  auVar49._4_4_ = iVar6;
  auVar49._0_4_ = iVar6;
  auVar49._8_4_ = iVar6;
  auVar49._12_4_ = iVar6;
  auVar49._16_4_ = iVar6;
  auVar49._20_4_ = iVar6;
  auVar49._24_4_ = iVar6;
  auVar49._28_4_ = iVar6;
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar45 = ZEXT416((uint)bit);
  local_360 = vpsrad_avx2(auVar29,auVar45);
  auVar29 = vpaddd_avx2(auVar20,auVar21);
  local_140 = vpsrad_avx2(auVar29,auVar45);
  auVar29 = vpmulld_avx2(local_140,auVar47);
  auVar29 = vpaddd_avx2(auVar21,auVar29);
  auVar20 = vpmulld_avx2(local_360,auVar49);
  auVar29 = vpaddd_avx2(auVar20,auVar29);
  iVar14 = -iVar14;
  auVar30._4_4_ = iVar14;
  auVar30._0_4_ = iVar14;
  auVar30._8_4_ = iVar14;
  auVar30._12_4_ = iVar14;
  auVar30._16_4_ = iVar14;
  auVar30._20_4_ = iVar14;
  auVar30._24_4_ = iVar14;
  auVar30._28_4_ = iVar14;
  auVar30 = vpmulld_avx2(local_360,auVar30);
  auVar20 = vpmulld_avx2(local_140,auVar49);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar30);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1b0);
  iVar6 = -iVar14;
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  local_160 = vpsrad_avx2(auVar22,auVar45);
  auVar37._4_4_ = iVar6;
  auVar37._0_4_ = iVar6;
  auVar37._8_4_ = iVar6;
  auVar37._12_4_ = iVar6;
  auVar37._16_4_ = iVar6;
  auVar37._20_4_ = iVar6;
  auVar37._24_4_ = iVar6;
  auVar37._28_4_ = iVar6;
  auVar22 = vpaddd_avx2(auVar27,auVar21);
  local_340 = vpsrad_avx2(auVar22,auVar45);
  auVar27 = vpmulld_avx2(local_340,auVar37);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x210);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar22 = vpmulld_avx2(local_160,auVar40);
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  auVar22 = vpaddd_avx2(auVar22,auVar27);
  auVar31._4_4_ = iVar14;
  auVar31._0_4_ = iVar14;
  auVar31._8_4_ = iVar14;
  auVar31._12_4_ = iVar14;
  auVar31._16_4_ = iVar14;
  auVar31._20_4_ = iVar14;
  auVar31._24_4_ = iVar14;
  auVar31._28_4_ = iVar14;
  auVar30 = vpmulld_avx2(local_340,auVar40);
  auVar27 = vpmulld_avx2(local_160,auVar31);
  auVar27 = vpaddd_avx2(auVar27,auVar21);
  auVar27 = vpaddd_avx2(auVar30,auVar27);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 400);
  iVar6 = -iVar14;
  auVar38._4_4_ = iVar6;
  auVar38._0_4_ = iVar6;
  auVar38._8_4_ = iVar6;
  auVar38._12_4_ = iVar6;
  auVar38._16_4_ = iVar6;
  auVar38._20_4_ = iVar6;
  auVar38._24_4_ = iVar6;
  auVar38._28_4_ = iVar6;
  iVar6 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x230);
  auVar41._4_4_ = iVar6;
  auVar41._0_4_ = iVar6;
  auVar41._8_4_ = iVar6;
  auVar41._12_4_ = iVar6;
  auVar41._16_4_ = iVar6;
  auVar41._20_4_ = iVar6;
  auVar41._24_4_ = iVar6;
  auVar41._28_4_ = iVar6;
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  auVar45 = ZEXT416((uint)bit);
  local_260 = vpsrad_avx2(auVar32,auVar45);
  auVar32 = vpaddd_avx2(auVar26,auVar21);
  local_240 = vpsrad_avx2(auVar32,auVar45);
  auVar26 = vpmulld_avx2(local_260,auVar38);
  auVar32 = vpmulld_avx2(local_240,auVar41);
  auVar32 = vpaddd_avx2(auVar21,auVar32);
  auVar32 = vpaddd_avx2(auVar26,auVar32);
  auVar28._4_4_ = iVar14;
  auVar28._0_4_ = iVar14;
  auVar28._8_4_ = iVar14;
  auVar28._12_4_ = iVar14;
  auVar28._16_4_ = iVar14;
  auVar28._20_4_ = iVar14;
  auVar28._24_4_ = iVar14;
  auVar28._28_4_ = iVar14;
  auVar30 = vpmulld_avx2(local_260,auVar41);
  auVar26 = vpmulld_avx2(local_240,auVar28);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar26 = vpaddd_avx2(auVar30,auVar26);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x180);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x240);
  auVar42._4_4_ = iVar6;
  auVar42._0_4_ = iVar6;
  auVar42._8_4_ = iVar6;
  auVar42._12_4_ = iVar6;
  auVar42._16_4_ = iVar6;
  auVar42._20_4_ = iVar6;
  auVar42._24_4_ = iVar6;
  auVar42._28_4_ = iVar6;
  iVar5 = -iVar14;
  auVar44._4_4_ = iVar5;
  auVar44._0_4_ = iVar5;
  auVar44._8_4_ = iVar5;
  auVar44._12_4_ = iVar5;
  auVar44._16_4_ = iVar5;
  auVar44._20_4_ = iVar5;
  auVar44._24_4_ = iVar5;
  auVar44._28_4_ = iVar5;
  auVar19 = vpaddd_avx2(auVar19,auVar21);
  auVar30 = vpsrad_avx2(auVar19,auVar45);
  auVar19 = vpaddd_avx2(auVar18,auVar21);
  local_920 = vpsrad_avx2(auVar19,auVar45);
  auVar19 = vpmulld_avx2(auVar30,auVar42);
  auVar19 = vpaddd_avx2(auVar19,auVar21);
  auVar18 = vpmulld_avx2(local_920,auVar44);
  local_9a0 = vpaddd_avx2(auVar19,auVar18);
  local_a00._4_4_ = iVar14;
  local_a00._0_4_ = iVar14;
  local_a00._8_4_ = iVar14;
  local_a00._12_4_ = iVar14;
  local_a00._16_4_ = iVar14;
  local_a00._20_4_ = iVar14;
  local_a00._24_4_ = iVar14;
  local_a00._28_4_ = iVar14;
  auVar19 = vpmulld_avx2(auVar30,local_a00);
  auVar19 = vpaddd_avx2(auVar19,auVar21);
  auVar18 = vpmulld_avx2(local_920,auVar42);
  local_9e0 = vpaddd_avx2(auVar19,auVar18);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1c0);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x200);
  iVar7 = -iVar14;
  local_860._4_4_ = iVar7;
  local_860._0_4_ = iVar7;
  local_860._8_4_ = iVar7;
  local_860._12_4_ = iVar7;
  local_860._16_4_ = iVar7;
  local_860._20_4_ = iVar7;
  local_860._24_4_ = iVar7;
  local_860._28_4_ = iVar7;
  iVar7 = -iVar5;
  local_980._4_4_ = iVar7;
  local_980._0_4_ = iVar7;
  local_980._8_4_ = iVar7;
  local_980._12_4_ = iVar7;
  local_980._16_4_ = iVar7;
  local_980._20_4_ = iVar7;
  local_980._24_4_ = iVar7;
  local_980._28_4_ = iVar7;
  auVar19 = vpaddd_avx2(auVar21,auVar17);
  local_8a0 = vpsrad_avx2(auVar19,auVar45);
  auVar19 = vpaddd_avx2(auVar21,auVar16);
  local_880 = vpsrad_avx2(auVar19,auVar45);
  auVar19 = vpmulld_avx2(local_880,local_980);
  auVar19 = vpaddd_avx2(auVar21,auVar19);
  auVar18 = vpmulld_avx2(local_8a0,local_860);
  local_a20 = vpaddd_avx2(auVar18,auVar19);
  local_940._4_4_ = iVar14;
  local_940._0_4_ = iVar14;
  local_940._8_4_ = iVar14;
  local_940._12_4_ = iVar14;
  local_940._16_4_ = iVar14;
  local_940._20_4_ = iVar14;
  local_940._24_4_ = iVar14;
  local_940._28_4_ = iVar14;
  auVar19 = vpmulld_avx2(local_880,local_940);
  auVar19 = vpaddd_avx2(auVar21,auVar19);
  auVar18 = vpmulld_avx2(local_8a0,local_980);
  local_a40 = vpaddd_avx2(auVar18,auVar19);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1a0);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x220);
  local_8e0._4_4_ = iVar7;
  local_8e0._0_4_ = iVar7;
  local_8e0._8_4_ = iVar7;
  local_8e0._12_4_ = iVar7;
  local_8e0._16_4_ = iVar7;
  local_8e0._20_4_ = iVar7;
  local_8e0._24_4_ = iVar7;
  local_8e0._28_4_ = iVar7;
  iVar8 = -iVar14;
  auVar17._4_4_ = iVar8;
  auVar17._0_4_ = iVar8;
  auVar17._8_4_ = iVar8;
  auVar17._12_4_ = iVar8;
  auVar17._16_4_ = iVar8;
  auVar17._20_4_ = iVar8;
  auVar17._24_4_ = iVar8;
  auVar17._28_4_ = iVar8;
  auVar19 = vpaddd_avx2(auVar21,auVar23);
  local_660 = vpsrad_avx2(auVar19,auVar45);
  auVar19 = vpaddd_avx2(auVar24,auVar21);
  local_960 = vpsrad_avx2(auVar19,auVar45);
  auVar19 = vpmulld_avx2(local_660,local_8e0);
  auVar19 = vpaddd_avx2(auVar19,auVar21);
  auVar18 = vpmulld_avx2(local_960,auVar17);
  local_a60 = vpaddd_avx2(auVar19,auVar18);
  auVar45 = ZEXT416((uint)bit);
  local_420 = vpsrad_avx2(auVar2,auVar45);
  auVar18._4_4_ = iVar14;
  auVar18._0_4_ = iVar14;
  auVar18._8_4_ = iVar14;
  auVar18._12_4_ = iVar14;
  auVar18._16_4_ = iVar14;
  auVar18._20_4_ = iVar14;
  auVar18._24_4_ = iVar14;
  auVar18._28_4_ = iVar14;
  auVar2 = vpmulld_avx2(local_660,auVar18);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar19 = vpmulld_avx2(local_960,local_8e0);
  local_a80 = vpaddd_avx2(auVar2,auVar19);
  local_80 = vpsrad_avx2(auVar3,auVar45);
  auVar2 = vpmulld_avx2(local_420,auVar44);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar3 = vpmulld_avx2(local_80,auVar42);
  local_aa0 = vpaddd_avx2(auVar2,auVar3);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1e0);
  auVar19._4_4_ = iVar14;
  auVar19._0_4_ = iVar14;
  auVar19._8_4_ = iVar14;
  auVar19._12_4_ = iVar14;
  auVar19._16_4_ = iVar14;
  auVar19._20_4_ = iVar14;
  auVar19._24_4_ = iVar14;
  auVar19._28_4_ = iVar14;
  auVar3 = vpmulld_avx2(auVar19,(undefined1  [32])*in);
  puVar9 = local_440;
  local_60 = local_900;
  local_440 = local_8c0;
  local_ca0 = auVar30._0_8_;
  uStack_c98 = auVar30._8_8_;
  uStack_c90 = auVar30._16_8_;
  uStack_c88 = auVar30._24_8_;
  local_460._0_8_ = local_ca0;
  local_460._8_8_ = uStack_c98;
  local_460._16_8_ = uStack_c90;
  local_460._24_8_ = uStack_c88;
  local_640 = local_920;
  local_560 = local_8a0;
  local_540 = local_880;
  local_740 = local_960;
  local_120 = vpsrad_avx2(auVar29,auVar45);
  local_380 = vpsrad_avx2(auVar20,auVar45);
  auVar2 = vpmulld_avx2(local_420,auVar42);
  auVar29 = vpmulld_avx2(local_80,local_a00);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar29,auVar2);
  local_320 = vpsrad_avx2(auVar22,auVar45);
  local_180 = vpsrad_avx2(auVar27,auVar45);
  local_9c0 = vpsrad_avx2(auVar32,auVar45);
  local_220 = vpsrad_avx2(auVar26,auVar45);
  local_620 = vpsrad_avx2(local_9a0,auVar45);
  local_280 = local_9c0;
  local_480 = vpsrad_avx2(local_9e0,auVar45);
  local_580 = vpsrad_avx2(local_a20,auVar45);
  local_520 = vpsrad_avx2(local_a40,auVar45);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar45);
  local_820[0] = alVar4[0];
  local_820[1] = alVar4[1];
  local_820[2] = alVar4[2];
  local_820[3] = alVar4[3];
  local_840[0] = alVar4[0];
  local_840[1] = alVar4[1];
  local_840[2] = alVar4[2];
  local_840[3] = alVar4[3];
  local_720 = vpsrad_avx2(local_a60,auVar45);
  local_680 = vpsrad_avx2(local_a80,auVar45);
  local_a0 = vpsrad_avx2(auVar2,auVar45);
  auVar45 = ZEXT416((uint)bit);
  local_400 = vpsrad_avx2(local_aa0,auVar45);
  auVar2 = vpmulld_avx2(local_900,auVar42);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar3 = vpmulld_avx2(local_8c0,auVar44);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_900,local_a00);
  auVar29 = vpmulld_avx2(local_8c0,auVar42);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  local_3e0 = vpsrad_avx2(auVar2,auVar45);
  local_c0 = vpsrad_avx2(auVar3,auVar45);
  iVar6 = -iVar6;
  auVar34._4_4_ = iVar6;
  auVar34._0_4_ = iVar6;
  auVar34._8_4_ = iVar6;
  auVar34._12_4_ = iVar6;
  auVar34._16_4_ = iVar6;
  auVar34._20_4_ = iVar6;
  auVar34._24_4_ = iVar6;
  auVar34._28_4_ = iVar6;
  auVar2 = vpmulld_avx2(local_140,auVar44);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar3 = vpmulld_avx2(local_360,auVar34);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar29 = vpmulld_avx2(local_360,auVar44);
  auVar3 = vpmulld_avx2(local_140,auVar42);
  auVar3 = vpaddd_avx2(auVar21,auVar3);
  auVar3 = vpaddd_avx2(auVar29,auVar3);
  local_e0 = vpsrad_avx2(auVar3,auVar45);
  local_3c0 = vpsrad_avx2(auVar2,auVar45);
  auVar29 = vpmulld_avx2(local_380,auVar34);
  auVar3 = vpmulld_avx2(local_380,auVar44);
  auVar20 = vpmulld_avx2(local_120,auVar44);
  auVar2 = vpmulld_avx2(local_120,auVar42);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpaddd_avx2(auVar20,auVar21);
  local_100 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpaddd_avx2(auVar3,auVar29);
  local_3a0 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpmulld_avx2(local_320,local_980);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar3 = vpmulld_avx2(local_180,local_940);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar35._4_4_ = iVar5;
  auVar35._0_4_ = iVar5;
  auVar35._8_4_ = iVar5;
  auVar35._12_4_ = iVar5;
  auVar35._16_4_ = iVar5;
  auVar35._20_4_ = iVar5;
  auVar35._24_4_ = iVar5;
  auVar35._28_4_ = iVar5;
  auVar3 = vpmulld_avx2(local_320,local_940);
  auVar29 = vpmulld_avx2(local_180,auVar35);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar29,auVar3);
  local_1a0 = vpsrad_avx2(auVar3,auVar45);
  local_300 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpmulld_avx2(local_160,local_940);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar3 = vpmulld_avx2(local_340,local_980);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_160,auVar35);
  auVar29 = vpmulld_avx2(local_340,local_940);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar29,auVar3);
  local_2e0 = vpsrad_avx2(auVar2,auVar45);
  local_1c0 = vpsrad_avx2(auVar3,auVar45);
  auVar2 = vpmulld_avx2(local_240,local_980);
  auVar2 = vpaddd_avx2(auVar21,auVar2);
  auVar3 = vpmulld_avx2(local_260,local_860);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar29 = vpmulld_avx2(local_260,local_980);
  auVar3 = vpmulld_avx2(local_240,local_940);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  local_1e0 = vpsrad_avx2(auVar3,auVar45);
  local_2c0 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpmulld_avx2(local_9c0,local_860);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar3 = vpmulld_avx2(local_220,local_980);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_9c0,local_980);
  auVar29 = vpmulld_avx2(local_220,local_940);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  local_2a0 = vpsrad_avx2(auVar2,auVar45);
  local_200 = vpsrad_avx2(auVar3,auVar45);
  local_7e0[0] = alVar4[0];
  local_7e0[1] = alVar4[1];
  local_7e0[2] = alVar4[2];
  local_7e0[3] = alVar4[3];
  local_800[0] = alVar4[0];
  local_800[1] = alVar4[1];
  local_800[2] = alVar4[2];
  local_800[3] = alVar4[3];
  local_6e0 = local_960;
  local_700 = local_720;
  local_6c0 = local_660;
  local_6a0 = local_680;
  auVar2 = vpmulld_avx2(local_620,auVar17);
  auVar3 = vpmulld_avx2(local_480,local_8e0);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_620,local_8e0);
  auVar29 = vpmulld_avx2(local_480,auVar18);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  local_600 = vpsrad_avx2(auVar2,auVar45);
  local_4a0 = vpsrad_avx2(auVar3,auVar45);
  iVar7 = -iVar7;
  auVar3 = vpmulld_avx2(local_920,auVar17);
  auVar2 = vpmulld_avx2(auVar30,local_8e0);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar20._4_4_ = iVar7;
  auVar20._0_4_ = iVar7;
  auVar20._8_4_ = iVar7;
  auVar20._12_4_ = iVar7;
  auVar20._16_4_ = iVar7;
  auVar20._20_4_ = iVar7;
  auVar20._24_4_ = iVar7;
  auVar20._28_4_ = iVar7;
  auVar29 = vpmulld_avx2(local_920,local_8e0);
  auVar3 = vpmulld_avx2(auVar30,auVar18);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  local_4c0 = vpsrad_avx2(auVar3,auVar45);
  auVar29 = vpmulld_avx2(local_8a0,auVar20);
  auVar3 = vpmulld_avx2(local_880,auVar17);
  auVar3 = vpaddd_avx2(auVar21,auVar3);
  auVar3 = vpaddd_avx2(auVar29,auVar3);
  local_5e0 = vpsrad_avx2(auVar2,auVar45);
  local_5c0 = vpsrad_avx2(auVar3,auVar45);
  auVar3 = vpmulld_avx2(local_8a0,auVar17);
  auVar2 = vpmulld_avx2(local_880,local_8e0);
  auVar2 = vpaddd_avx2(auVar21,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_4e0 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpmulld_avx2(local_580,auVar20);
  auVar3 = vpmulld_avx2(local_520,auVar17);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  iVar14 = -iVar14;
  local_5a0 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpmulld_avx2(local_580,auVar17);
  auVar3 = vpmulld_avx2(local_520,local_8e0);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_500 = vpsrad_avx2(auVar2,auVar45);
  auVar3._4_4_ = local_ac0;
  auVar3._0_4_ = local_ac0;
  auVar3._8_4_ = local_ac0;
  auVar3._12_4_ = local_ac0;
  auVar3._16_4_ = local_ac0;
  auVar3._20_4_ = local_ac0;
  auVar3._24_4_ = local_ac0;
  auVar3._28_4_ = local_ac0;
  auVar2._4_4_ = local_ae0;
  auVar2._0_4_ = local_ae0;
  auVar2._8_4_ = local_ae0;
  auVar2._12_4_ = local_ae0;
  auVar2._16_4_ = local_ae0;
  auVar2._20_4_ = local_ae0;
  auVar2._24_4_ = local_ae0;
  auVar2._28_4_ = local_ae0;
  uVar13 = 0x20;
  do {
    lVar12 = 0;
    uVar15 = uVar13;
    do {
      auVar29 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar15 ^ 7) * 4),
                            *(undefined1 (*) [32])(puVar9 + lVar12));
      auVar27 = vpsubd_avx2(*(undefined1 (*) [32])(puVar9 + lVar12),
                            *(undefined1 (*) [32])(local_840 + (uVar15 ^ 7) * 4));
      auVar29 = vpmaxsd_avx2(auVar29,auVar3);
      auVar22 = vpminsd_avx2(auVar29,auVar2);
      auVar29 = vpmaxsd_avx2(auVar27,auVar3);
      auVar29 = vpminsd_avx2(auVar29,auVar2);
      *(undefined1 (*) [32])(puVar9 + lVar12) = auVar22;
      *(undefined1 (*) [32])(local_840 + (uVar15 ^ 7) * 4) = auVar29;
      auVar29 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar15 ^ 8) * 4),
                            *(undefined1 (*) [32])(local_840 + (uVar15 ^ 0xf) * 4));
      auVar27 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar15 ^ 0xf) * 4),
                            *(undefined1 (*) [32])(local_840 + (uVar15 ^ 8) * 4));
      auVar29 = vpmaxsd_avx2(auVar29,auVar3);
      auVar22 = vpminsd_avx2(auVar29,auVar2);
      auVar29 = vpmaxsd_avx2(auVar27,auVar3);
      auVar29 = vpminsd_avx2(auVar29,auVar2);
      *(undefined1 (*) [32])(local_840 + (uVar15 ^ 0xf) * 4) = auVar22;
      *(undefined1 (*) [32])(local_840 + (uVar15 ^ 8) * 4) = auVar29;
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x80);
    puVar9 = puVar9 + 0x200;
    uVar11 = (uint)uVar13;
    uVar13 = uVar13 + 0x10;
  } while (uVar11 < 0x30);
  auVar25._4_4_ = iVar14;
  auVar25._0_4_ = iVar14;
  auVar25._8_4_ = iVar14;
  auVar25._12_4_ = iVar14;
  auVar25._16_4_ = iVar14;
  auVar25._20_4_ = iVar14;
  auVar25._24_4_ = iVar14;
  auVar25._28_4_ = iVar14;
  pauVar10 = &local_640;
  local_760 = local_840[0];
  lStack_758 = local_840[1];
  lStack_750 = local_840[2];
  lStack_748 = local_840[3];
  local_780 = local_820[0];
  lStack_778 = local_820[1];
  lStack_770 = local_820[2];
  lStack_768 = local_820[3];
  local_7a0 = local_800[0];
  lStack_798 = local_800[1];
  lStack_790 = local_800[2];
  lStack_788 = local_800[3];
  local_7c0 = local_7e0[0];
  lStack_7b8 = local_7e0[1];
  lStack_7b0 = local_7e0[2];
  lStack_7a8 = local_7e0[3];
  auVar29 = vpmulld_avx2(local_700,auVar25);
  auVar22 = vpmulld_avx2(local_6a0,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar29,auVar22);
  auVar22 = vpsrad_avx2(auVar29,auVar45);
  auVar29 = vpaddd_avx2(local_6a0,local_700);
  auVar29 = vpmulld_avx2(auVar29,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  local_6a0 = vpsrad_avx2(auVar29,auVar45);
  local_700 = auVar22;
  auVar29 = vpmulld_avx2(local_6e0,auVar25);
  auVar22 = vpmulld_avx2(local_6c0,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar29,auVar22);
  auVar22 = vpsrad_avx2(auVar29,auVar45);
  auVar29 = vpaddd_avx2(local_6c0,local_6e0);
  auVar29 = vpmulld_avx2(auVar29,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  local_6c0 = vpsrad_avx2(auVar29,auVar45);
  local_6e0 = auVar22;
  uVar13 = 0x10;
  do {
    auVar29 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar13 ^ 7) * 4),*pauVar10);
    auVar27 = vpsubd_avx2(*pauVar10,*(undefined1 (*) [32])(local_840 + (uVar13 ^ 7) * 4));
    auVar29 = vpmaxsd_avx2(auVar29,auVar3);
    auVar22 = vpminsd_avx2(auVar29,auVar2);
    auVar29 = vpmaxsd_avx2(auVar27,auVar3);
    auVar29 = vpminsd_avx2(auVar29,auVar2);
    *pauVar10 = auVar22;
    *(undefined1 (*) [32])(local_840 + (uVar13 ^ 7) * 4) = auVar29;
    auVar29 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar13 ^ 8) * 4),
                          *(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4));
    auVar27 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4),
                          *(undefined1 (*) [32])(local_840 + (uVar13 ^ 8) * 4));
    auVar29 = vpmaxsd_avx2(auVar29,auVar3);
    auVar22 = vpminsd_avx2(auVar29,auVar2);
    auVar29 = vpmaxsd_avx2(auVar27,auVar3);
    auVar29 = vpminsd_avx2(auVar29,auVar2);
    *(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4) = auVar22;
    *(undefined1 (*) [32])(local_840 + (uVar13 ^ 8) * 4) = auVar29;
    uVar13 = uVar13 + 1;
    pauVar10 = pauVar10 + 1;
  } while (uVar13 != 0x14);
  pauVar10 = &local_660;
  auVar29 = vpmulld_avx2(local_3c0,auVar17);
  auVar22 = vpmulld_avx2(local_e0,local_8e0);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar29,auVar22);
  auVar22 = vpmulld_avx2(local_3a0,auVar17);
  auVar27 = vpmulld_avx2(local_100,local_8e0);
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  auVar22 = vpaddd_avx2(auVar22,auVar27);
  auVar27 = vpmulld_avx2(local_380,auVar17);
  auVar32 = vpmulld_avx2(local_120,local_8e0);
  auVar27 = vpaddd_avx2(auVar27,auVar21);
  auVar27 = vpaddd_avx2(auVar27,auVar32);
  auVar32 = vpmulld_avx2(local_360,auVar17);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  auVar26 = vpmulld_avx2(local_140,local_8e0);
  auVar32 = vpaddd_avx2(auVar32,auVar26);
  auVar26 = vpmulld_avx2(local_360,local_8e0);
  auVar16 = vpmulld_avx2(local_140,auVar18);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar26 = vpaddd_avx2(auVar26,auVar16);
  auVar16 = vpsrad_avx2(auVar29,auVar45);
  auVar23 = vpsrad_avx2(auVar22,auVar45);
  auVar27 = vpsrad_avx2(auVar27,auVar45);
  local_360 = vpsrad_avx2(auVar32,auVar45);
  local_140 = vpsrad_avx2(auVar26,auVar45);
  auVar29 = vpmulld_avx2(local_380,local_8e0);
  auVar22 = vpmulld_avx2(local_120,auVar18);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar22,auVar29);
  local_120 = vpsrad_avx2(auVar29,auVar45);
  auVar29 = vpmulld_avx2(local_8e0,local_3a0);
  auVar22 = vpmulld_avx2(local_100,auVar18);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar22,auVar29);
  local_100 = vpsrad_avx2(auVar29,auVar45);
  auVar29 = vpmulld_avx2(local_8e0,local_3c0);
  auVar22 = vpmulld_avx2(auVar18,local_e0);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar22,auVar29);
  local_e0 = vpsrad_avx2(auVar29,auVar45);
  local_3c0 = auVar16;
  local_3a0 = auVar23;
  local_380 = auVar27;
  auVar29 = vpmulld_avx2(local_340,auVar20);
  auVar22 = vpmulld_avx2(local_160,auVar17);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar29,auVar22);
  auVar22 = vpmulld_avx2(local_320,auVar20);
  auVar27 = vpmulld_avx2(local_180,auVar17);
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  auVar22 = vpaddd_avx2(auVar22,auVar27);
  auVar27 = vpmulld_avx2(local_300,auVar20);
  auVar32 = vpmulld_avx2(local_1a0,auVar17);
  auVar27 = vpaddd_avx2(auVar27,auVar21);
  auVar27 = vpaddd_avx2(auVar32,auVar27);
  auVar32 = vpmulld_avx2(local_2e0,auVar20);
  auVar20 = vpmulld_avx2(local_2e0,auVar17);
  auVar26 = vpmulld_avx2(local_1c0,local_8e0);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar26);
  auVar26 = vpmulld_avx2(local_1c0,auVar17);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  local_1c0 = vpsrad_avx2(auVar20,auVar45);
  auVar20 = vpaddd_avx2(auVar32,auVar26);
  auVar32 = vpmulld_avx2(local_300,auVar17);
  auVar26 = vpmulld_avx2(local_1a0,local_8e0);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  auVar32 = vpaddd_avx2(auVar32,auVar26);
  local_1a0 = vpsrad_avx2(auVar32,auVar45);
  auVar32 = vpmulld_avx2(local_320,auVar17);
  auVar26 = vpmulld_avx2(local_180,local_8e0);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  auVar32 = vpaddd_avx2(auVar32,auVar26);
  local_180 = vpsrad_avx2(auVar32,auVar45);
  auVar32 = vpmulld_avx2(local_340,auVar17);
  auVar26 = vpmulld_avx2(local_160,local_8e0);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  auVar32 = vpaddd_avx2(auVar32,auVar26);
  local_340 = vpsrad_avx2(auVar29,auVar45);
  local_160 = vpsrad_avx2(auVar32,auVar45);
  local_320 = vpsrad_avx2(auVar22,auVar45);
  local_300 = vpsrad_avx2(auVar27,auVar45);
  local_2e0 = vpsrad_avx2(auVar20,auVar45);
  lVar12 = 0;
  do {
    auVar29 = vpaddd_avx2(*pauVar10,*(undefined1 (*) [32])((long)local_840 + lVar12));
    auVar22 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_840 + lVar12),*pauVar10);
    auVar29 = vpmaxsd_avx2(auVar29,auVar3);
    auVar20 = vpminsd_avx2(auVar29,auVar2);
    auVar29 = vpmaxsd_avx2(auVar22,auVar3);
    auVar29 = vpminsd_avx2(auVar29,auVar2);
    *(undefined1 (*) [32])((long)local_840 + lVar12) = auVar20;
    *pauVar10 = auVar29;
    lVar12 = lVar12 + 0x20;
    pauVar10 = pauVar10 + -1;
  } while (lVar12 != 0x100);
  pauVar10 = &local_440;
  auVar29 = vpmulld_avx2(local_5c0,auVar25);
  auVar20 = vpmulld_avx2(local_4e0,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar29,auVar20);
  auVar20 = vpmulld_avx2(local_5a0,auVar25);
  auVar22 = vpmulld_avx2(local_500,auVar19);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar22);
  auVar22 = vpmulld_avx2(local_580,auVar25);
  auVar27 = vpmulld_avx2(local_520,auVar19);
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  auVar22 = vpaddd_avx2(auVar22,auVar27);
  auVar27 = vpmulld_avx2(local_560,auVar25);
  auVar32 = vpmulld_avx2(local_540,auVar19);
  auVar27 = vpaddd_avx2(auVar27,auVar21);
  auVar27 = vpaddd_avx2(auVar27,auVar32);
  auVar32 = vpaddd_avx2(local_540,local_560);
  auVar32 = vpmulld_avx2(auVar32,auVar19);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  local_540 = vpsrad_avx2(auVar32,auVar45);
  auVar32 = vpaddd_avx2(local_520,local_580);
  auVar32 = vpmulld_avx2(auVar32,auVar19);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  local_520 = vpsrad_avx2(auVar32,auVar45);
  auVar32 = vpaddd_avx2(local_500,local_5a0);
  auVar32 = vpmulld_avx2(auVar32,auVar19);
  auVar32 = vpaddd_avx2(auVar32,auVar21);
  local_500 = vpsrad_avx2(auVar32,auVar45);
  auVar32 = vpaddd_avx2(local_5c0,local_4e0);
  local_5c0 = vpsrad_avx2(auVar29,auVar45);
  auVar29 = vpmulld_avx2(auVar32,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  local_4e0 = vpsrad_avx2(auVar29,auVar45);
  local_5a0 = vpsrad_avx2(auVar20,auVar45);
  local_580 = vpsrad_avx2(auVar22,auVar45);
  local_560 = vpsrad_avx2(auVar27,auVar45);
  uVar13 = 0x20;
  do {
    auVar29 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4),*pauVar10);
    auVar22 = vpsubd_avx2(*pauVar10,*(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4));
    auVar29 = vpmaxsd_avx2(auVar29,auVar3);
    auVar20 = vpminsd_avx2(auVar29,auVar2);
    auVar29 = vpmaxsd_avx2(auVar22,auVar3);
    auVar29 = vpminsd_avx2(auVar29,auVar2);
    *pauVar10 = auVar20;
    *(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4) = auVar29;
    uVar13 = uVar13 + 1;
    pauVar10 = pauVar10 + 1;
  } while (uVar13 != 0x28);
  uVar13 = 0x30;
  pauVar10 = &local_240;
  do {
    auVar29 = vpaddd_avx2(*pauVar10,*(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4));
    auVar22 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4),*pauVar10);
    auVar29 = vpmaxsd_avx2(auVar29,auVar3);
    auVar20 = vpminsd_avx2(auVar29,auVar2);
    auVar29 = vpmaxsd_avx2(auVar22,auVar3);
    auVar29 = vpminsd_avx2(auVar29,auVar2);
    *(undefined1 (*) [32])(local_840 + (uVar13 ^ 0xf) * 4) = auVar20;
    *pauVar10 = auVar29;
    uVar13 = uVar13 + 1;
    pauVar10 = pauVar10 + 1;
  } while (uVar13 != 0x38);
  pauVar10 = &local_460;
  lVar12 = 0;
  do {
    auVar29 = vpaddd_avx2(*pauVar10,*(undefined1 (*) [32])((long)local_840 + lVar12));
    auVar22 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_840 + lVar12),*pauVar10);
    auVar29 = vpmaxsd_avx2(auVar29,auVar3);
    auVar20 = vpminsd_avx2(auVar29,auVar2);
    auVar29 = vpmaxsd_avx2(auVar22,auVar3);
    auVar29 = vpminsd_avx2(auVar29,auVar2);
    *(undefined1 (*) [32])((long)local_840 + lVar12) = auVar20;
    *pauVar10 = auVar29;
    lVar12 = lVar12 + 0x20;
    pauVar10 = pauVar10 + -1;
  } while (lVar12 != 0x200);
  auVar2 = vpmulld_avx2(local_340,auVar25);
  auVar3 = vpmulld_avx2(local_160,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_320,auVar25);
  auVar29 = vpmulld_avx2(local_180,auVar19);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  auVar29 = vpmulld_avx2(local_300,auVar25);
  auVar20 = vpmulld_avx2(local_1a0,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar29,auVar20);
  auVar20 = vpmulld_avx2(local_2e0,auVar25);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar22 = vpmulld_avx2(local_1c0,auVar19);
  auVar20 = vpaddd_avx2(auVar20,auVar22);
  auVar22 = vpaddd_avx2(local_1c0,local_2e0);
  auVar32 = vpsrad_avx2(auVar2,auVar45);
  auVar26 = vpsrad_avx2(auVar3,auVar45);
  auVar18 = vpsrad_avx2(auVar29,auVar45);
  local_2e0 = vpsrad_avx2(auVar20,auVar45);
  auVar2 = vpmulld_avx2(auVar22,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  local_1c0 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpaddd_avx2(local_1a0,local_300);
  auVar2 = vpmulld_avx2(auVar2,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  local_1a0 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpaddd_avx2(local_180,local_320);
  auVar2 = vpmulld_avx2(auVar2,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  local_180 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpaddd_avx2(local_340,local_160);
  auVar2 = vpmulld_avx2(auVar2,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  local_160 = vpsrad_avx2(auVar2,auVar45);
  auVar2 = vpmulld_avx2(local_2c0,auVar25);
  auVar3 = vpmulld_avx2(local_1e0,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_2a0,auVar25);
  auVar29 = vpmulld_avx2(local_200,auVar19);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar3,auVar29);
  auVar29 = vpmulld_avx2(local_280,auVar25);
  auVar20 = vpmulld_avx2(local_220,auVar19);
  auVar29 = vpaddd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar29,auVar20);
  auVar22 = vpmulld_avx2(local_260,auVar25);
  auVar20 = vpaddd_avx2(local_240,local_260);
  auVar27 = vpmulld_avx2(local_240,auVar19);
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  auVar20 = vpmulld_avx2(auVar20,auVar19);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  local_240 = vpsrad_avx2(auVar20,auVar45);
  auVar20 = vpaddd_avx2(auVar22,auVar27);
  auVar22 = vpaddd_avx2(local_220,local_280);
  auVar27 = vpaddd_avx2(local_200,local_2a0);
  auVar22 = vpmulld_avx2(auVar22,auVar19);
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  local_220 = vpsrad_avx2(auVar22,auVar45);
  auVar22 = vpmulld_avx2(auVar27,auVar19);
  auVar22 = vpaddd_avx2(auVar22,auVar21);
  local_200 = vpsrad_avx2(auVar22,auVar45);
  auVar22 = vpaddd_avx2(local_2c0,local_1e0);
  auVar22 = vpmulld_avx2(auVar22,auVar19);
  local_2c0 = vpsrad_avx2(auVar2,auVar45);
  local_2a0 = vpsrad_avx2(auVar3,auVar45);
  local_280 = vpsrad_avx2(auVar29,auVar45);
  local_260 = vpsrad_avx2(auVar20,auVar45);
  auVar21 = vpaddd_avx2(auVar22,auVar21);
  local_1e0 = vpsrad_avx2(auVar21,auVar45);
  iStack_adc = local_ae0;
  iStack_ad8 = local_ae0;
  iStack_ad4 = local_ae0;
  iStack_ad0 = local_ae0;
  iStack_acc = local_ae0;
  iStack_ac8 = local_ae0;
  iStack_ac4 = local_ae0;
  iStack_abc = local_ac0;
  iStack_ab8 = local_ac0;
  iStack_ab4 = local_ac0;
  iStack_ab0 = local_ac0;
  iStack_aac = local_ac0;
  iStack_aa8 = local_ac0;
  iStack_aa4 = local_ac0;
  local_340 = auVar32;
  local_320 = auVar26;
  local_300 = auVar18;
  idct64_stage11_avx2(&local_840,out,do_cols,bd,out_shift,(__m256i *)&local_ac0,
                      (__m256i *)&local_ae0);
  return;
}

Assistant:

static void idct64_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  const __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  const __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  const __m256i cospi_m28_m36 = pair_set_w16_epi16(-cospi[28], -cospi[36]);
  const __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  const __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  const __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  const __m256i cospi_m12_m52 = pair_set_w16_epi16(-cospi[12], -cospi[52]);
  const __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  const __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  const __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  const __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[8] = input[4];
  x[16] = input[2];
  x[24] = input[6];
  x[32] = input[1];
  x[40] = input[5];
  x[48] = input[3];
  x[56] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[38] = x[39];
  x[41] = x[40];
  x[46] = x[47];
  x[49] = x[48];
  x[54] = x[55];
  x[57] = x[56];
  x[62] = x[63];

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  x[17] = x[16];
  x[22] = x[23];
  x[25] = x[24];
  x[30] = x[31];
  btf_16_w16_avx2(cospi_m04_p60, cospi_p60_p04, &x[33], &x[62], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m28_m36, cospi_m36_p28, &x[38], &x[57], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m20_p44, cospi_p44_p20, &x[41], &x[54], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m12_m52, cospi_m52_p12, &x[46], &x[49], _r,
                  INV_COS_BIT);

  // stage 5
  x[9] = x[8];
  x[14] = x[15];
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x[17], &x[30], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x[22], &x[25], _r,
                  INV_COS_BIT);
  x[35] = x[32];
  x[34] = x[33];
  x[36] = x[39];
  x[37] = x[38];
  x[43] = x[40];
  x[42] = x[41];
  x[44] = x[47];
  x[45] = x[46];
  x[51] = x[48];
  x[50] = x[49];
  x[52] = x[55];
  x[53] = x[54];
  x[59] = x[56];
  x[58] = x[57];
  x[60] = x[63];
  x[61] = x[62];

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  x[19] = x[16];
  x[18] = x[17];
  x[20] = x[23];
  x[21] = x[22];
  x[27] = x[24];
  x[26] = x[25];
  x[28] = x[31];
  x[29] = x[30];
  idct64_stage6_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  x[11] = x[8];
  x[10] = x[9];
  x[12] = x[15];
  x[13] = x[14];
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  x[7] = x[0];
  x[6] = x[1];
  x[5] = x[2];
  x[4] = x[3];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}